

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

Result<wasm::Ok> *
wasm::WATParser::makeTupleExtract<wasm::WATParser::ParseDefsCtx>
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDefsCtx *ctx,Index pos,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          *annotations)

{
  __index_type *__return_storage_ptr___00;
  uint32_t arity_00;
  bool bVar1;
  Err *pEVar2;
  uint *puVar3;
  allocator<char> local_101;
  string local_100;
  Err local_e0;
  _Optional_payload_base<unsigned_int> local_bc;
  optional<unsigned_int> index;
  Err *err;
  undefined1 local_78 [8];
  Result<unsigned_int> _val;
  Result<unsigned_int> arity;
  vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
  *annotations_local;
  Index pos_local;
  ParseDefsCtx *ctx_local;
  
  __return_storage_ptr___00 =
       (__index_type *)
       ((long)&_val.val.super__Variant_base<unsigned_int,_wasm::Err>.
               super__Move_assign_alias<unsigned_int,_wasm::Err>.
               super__Copy_assign_alias<unsigned_int,_wasm::Err>.
               super__Move_ctor_alias<unsigned_int,_wasm::Err>.
               super__Copy_ctor_alias<unsigned_int,_wasm::Err> + 0x20);
  tupleArity<wasm::WATParser::ParseDefsCtx>((Result<unsigned_int> *)__return_storage_ptr___00,ctx);
  Result<unsigned_int>::Result
            ((Result<unsigned_int> *)local_78,(Result<unsigned_int> *)__return_storage_ptr___00);
  pEVar2 = Result<unsigned_int>::getErr((Result<unsigned_int> *)local_78);
  if (pEVar2 != (Err *)0x0) {
    wasm::Err::Err((Err *)&index.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                           super__Optional_payload_base<unsigned_int>._M_engaged,pEVar2);
    Result<wasm::Ok>::Result
              (__return_storage_ptr__,
               (Err *)&index.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                       super__Optional_payload_base<unsigned_int>._M_engaged);
    wasm::Err::~Err((Err *)&index.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                            super__Optional_payload_base<unsigned_int>._M_engaged);
  }
  index.super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int>._M_payload._M_value._1_3_ = 0;
  index.super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int>._M_payload._M_value._0_1_ = pEVar2 != (Err *)0x0;
  Result<unsigned_int>::~Result((Result<unsigned_int> *)local_78);
  if (index.super__Optional_base<unsigned_int,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_int>._M_payload._M_value == 0) {
    local_bc = (_Optional_payload_base<unsigned_int>)Lexer::takeU32(&ctx->in);
    bVar1 = std::optional::operator_cast_to_bool((optional *)&local_bc);
    if (bVar1) {
      puVar3 = Result<unsigned_int>::operator*
                         ((Result<unsigned_int> *)
                          ((long)&_val.val.super__Variant_base<unsigned_int,_wasm::Err>.
                                  super__Move_assign_alias<unsigned_int,_wasm::Err>.
                                  super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                                  super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                                  super__Copy_ctor_alias<unsigned_int,_wasm::Err> + 0x20));
      arity_00 = *puVar3;
      puVar3 = std::optional<unsigned_int>::operator*((optional<unsigned_int> *)&local_bc);
      ParseDefsCtx::makeTupleExtract(__return_storage_ptr__,ctx,pos,annotations,arity_00,*puVar3);
      index.super__Optional_base<unsigned_int,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_int>._M_payload._M_value = 1;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_100,"expected tuple index",&local_101);
      Lexer::err(&local_e0,&ctx->in,&local_100);
      Result<wasm::Ok>::Result(__return_storage_ptr__,&local_e0);
      wasm::Err::~Err(&local_e0);
      std::__cxx11::string::~string((string *)&local_100);
      std::allocator<char>::~allocator(&local_101);
      index.super__Optional_base<unsigned_int,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_int>._M_payload._M_value = 1;
    }
  }
  Result<unsigned_int>::~Result
            ((Result<unsigned_int> *)
             ((long)&_val.val.super__Variant_base<unsigned_int,_wasm::Err>.
                     super__Move_assign_alias<unsigned_int,_wasm::Err>.
                     super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                     super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                     super__Copy_ctor_alias<unsigned_int,_wasm::Err> + 0x20));
  return __return_storage_ptr__;
}

Assistant:

Result<> makeTupleExtract(Ctx& ctx,
                          Index pos,
                          const std::vector<Annotation>& annotations) {
  auto arity = tupleArity(ctx);
  CHECK_ERR(arity);
  auto index = ctx.in.takeU32();
  if (!index) {
    return ctx.in.err("expected tuple index");
  }
  return ctx.makeTupleExtract(pos, annotations, *arity, *index);
}